

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O1

Var Js::JavascriptObject::EntryDefineProperty(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  Var pvVar7;
  JavascriptCopyOnAccessNativeIntArray *this;
  RecyclableObject *obj;
  RecyclableObject *pRVar8;
  PropertyRecord *pPVar9;
  int in_stack_00000010;
  undefined1 local_78 [8];
  PropertyDescriptor propertyDescriptor;
  CallInfo callInfo_local;
  ArgumentReader args;
  PropertyRecord *propertyRecord;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  propertyDescriptor._40_8_ = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != propertyDescriptor._40_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x520,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00cf3004;
    *puVar6 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  callInfo_local = (CallInfo)propertyDescriptor._40_8_;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)&callInfo_local,(CallInfo *)&propertyDescriptor.Configurable);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if ((propertyDescriptor._40_8_ & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x523,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00cf3004:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if (((ulong)callInfo_local & 0xfffffe) != 0) {
    pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,1);
    BVar4 = JavascriptOperators::IsObject(pvVar7);
    if (BVar4 != 0) {
      pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,1);
      if (pvVar7 != (Var)0x0) {
        bVar3 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(pvVar7);
        if (bVar3) {
          this = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(pvVar7);
        }
        else {
          this = (JavascriptCopyOnAccessNativeIntArray *)0x0;
        }
        if (this != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
          JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this);
        }
      }
      pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,1);
      obj = VarTo<Js::RecyclableObject>(pvVar7);
      if ((((obj->type).ptr)->typeId == TypeIds_HostDispatch) &&
         (iVar5 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x55])(obj,EntryDefineProperty), iVar5 != 0)) {
        return obj;
      }
      if ((callInfo_local._0_4_ & 0xffffff) < 3) {
        pRVar8 = (((((obj->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                 undefinedValue.ptr;
      }
      else {
        pRVar8 = (RecyclableObject *)Arguments::operator[]((Arguments *)&callInfo_local,2);
      }
      JavascriptConversion::ToPropertyKey
                (pRVar8,pSVar1,(PropertyRecord **)&args.super_Arguments.Values,
                 (PropertyString **)0x0);
      if (((ulong)callInfo_local & 0xfffffc) == 0) {
        pRVar8 = (((((obj->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                 undefinedValue.ptr;
      }
      else {
        pRVar8 = (RecyclableObject *)Arguments::operator[]((Arguments *)&callInfo_local,3);
      }
      PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_78);
      BVar4 = JavascriptOperators::ToPropertyDescriptor
                        (pRVar8,(PropertyDescriptor *)local_78,pSVar1);
      if (BVar4 == 0) {
        pPVar9 = ScriptContext::GetPropertyName
                           (pSVar1,*(PropertyId *)(args.super_Arguments.Values + 1));
        JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec2c,(PCWSTR)(pPVar9 + 1));
      }
      if (DAT_015d346b == '\x01') {
        ModifyGetterSetterFuncName
                  ((PropertyRecord *)args.super_Arguments.Values,(PropertyDescriptor *)local_78,
                   pSVar1);
      }
      BVar4 = DefineOwnPropertyHelper
                        (obj,*(PropertyId *)(args.super_Arguments.Values + 1),
                         (PropertyDescriptor *)local_78,pSVar1,true);
      if (BVar4 != 0) {
        return obj;
      }
      pPVar9 = ScriptContext::GetPropertyName
                         (pSVar1,*(PropertyId *)(args.super_Arguments.Values + 1));
      JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec27,(PCWSTR)(pPVar9 + 1));
    }
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec36,L"Object.defineProperty");
}

Assistant:

Var JavascriptObject::EntryDefineProperty(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    if (args.Info.Count < 2 || !JavascriptOperators::IsObject(args[1]))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("Object.defineProperty"));
    }

#if ENABLE_COPYONACCESS_ARRAY
    JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(args[1]);
#endif
    RecyclableObject* obj = VarTo<RecyclableObject>(args[1]);

    // If the object is HostDispatch try to invoke the operation remotely
    if (obj->GetTypeId() == TypeIds_HostDispatch)
    {
        if (obj->InvokeBuiltInOperationRemotely(EntryDefineProperty, args, NULL))
        {
            return obj;
        }
    }

    Var propertyKey = args.Info.Count > 2 ? args[2] : obj->GetLibrary()->GetUndefined();
    PropertyRecord const * propertyRecord;
    JavascriptConversion::ToPropertyKey(propertyKey, scriptContext, &propertyRecord, nullptr);

    Var descVar = args.Info.Count > 3 ? args[3] : obj->GetLibrary()->GetUndefined();
    PropertyDescriptor propertyDescriptor;
    if (!JavascriptOperators::ToPropertyDescriptor(descVar, &propertyDescriptor, scriptContext))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_PropertyDescriptor_Invalid, scriptContext->GetPropertyName(propertyRecord->GetPropertyId())->GetBuffer());
    }

    if (CONFIG_FLAG(UseFullName))
    {
        ModifyGetterSetterFuncName(propertyRecord, propertyDescriptor, scriptContext);
    }

    BOOL success = DefineOwnPropertyHelper(obj, propertyRecord->GetPropertyId(), propertyDescriptor, scriptContext);
    if (!success)
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_DefineProperty_Default, scriptContext->GetPropertyName(propertyRecord->GetPropertyId())->GetBuffer());
    }

    return obj;
}